

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Normalization.hpp
# Opt level: O3

Option<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
* __thiscall
Kernel::InequalityNormalizer::tryNormalizeInterpreted
          (Option<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
           *__return_storage_ptr__,InequalityNormalizer *this,Literal *lit)

{
  anon_class_24_3_7672fa5b clsr;
  anon_class_24_3_7672fa5b clsr_00;
  Option<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>_> out;
  anon_class_1_0_00000001 wrapCoproduct;
  anon_class_16_2_20c7215e local_d0;
  Literal **local_c0;
  OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
  local_b8;
  Literal *local_98;
  Option<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
  local_90;
  Option<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>_> local_70;
  Literal *local_50;
  Option<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
  local_48;
  
  local_d0.lit = &local_50;
  local_d0.this = this;
  local_98 = lit;
  local_50 = lit;
  tryNormalizeInterpreted<Kernel::NumTraits<Kernel::IntegerConstantType>_>::anon_class_16_2_20c7215e
  ::operator()(&local_70,&local_d0);
  if (local_70.
      super_OptionBase<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>_>.
      _isSome != true) {
    local_b8._elem._elem._12_5_ = 0;
    local_b8._elem._elem._17_4_ = EQ;
    local_b8._isSome = false;
    local_b8._1_3_ = 0;
    local_b8._elem._elem._0_4_ = 0;
    local_b8._elem._elem.init._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
    .
    super_RawCoproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>
    ._content[3] = '\0';
    local_b8._elem._elem._9_3_ = 0;
  }
  else {
    local_b8._elem._elem._0_4_ =
         local_70.
         super_OptionBase<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>_>.
         _elem._elem.init._term._id << 8;
    local_b8._elem._elem.init._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
    .
    super_RawCoproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>
    ._content[3] = (char)((uint)local_70.
                                super_OptionBase<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>_>
                                ._elem._elem._0_4_ >> 0x18);
    local_b8._elem._elem._9_3_ =
         SUB83(local_70.
               super_OptionBase<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>_>
               ._elem._elem.init._term._ptr,0);
    local_b8._elem._elem._12_5_ =
         (undefined5)
         ((ulong)local_70.
                 super_OptionBase<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>_>
                 ._elem._elem._8_8_ >> 0x18);
    local_b8._elem._elem._17_4_ =
         local_70.
         super_OptionBase<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>_>.
         _elem._elem.init._symbol;
  }
  local_b8._elem._elem._21_7_ = 0;
  local_b8._elem._elem._5_4_ = 0;
  local_b8._isSome =
       local_70.
       super_OptionBase<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>_>.
       _isSome == true;
  clsr.this = this;
  clsr.wrapCoproduct = (anon_class_1_0_00000001 *)&local_50;
  clsr.lit = &local_98;
  local_d0.lit = &local_50;
  local_d0.this = this;
  local_c0 = &local_98;
  Lib::
  Option<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
  ::
  orElse<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_Normalization_hpp:335:12),_true>
            (&local_48,
             (Option<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
              *)&local_b8,clsr);
  clsr_00.this = this;
  clsr_00.wrapCoproduct = (anon_class_1_0_00000001 *)&local_50;
  clsr_00.lit = &local_98;
  local_d0.lit = &local_50;
  local_d0.this = this;
  local_c0 = &local_98;
  Lib::
  Option<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
  ::
  orElse<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_Normalization_hpp:336:12),_true>
            (&local_90,&local_48,clsr_00);
  if (local_90.
      super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
      ._isSome == true) {
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->
             super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
             )._elem._elem + 4) = 0;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->
             super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
             )._elem._elem + 0xc) = 0;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->
             super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
             )._elem._elem + 0x14) = 0;
    *(byte *)&(__return_storage_ptr__->
              super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
              )._elem._elem =
         local_90.
         super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
         ._elem._elem._0_1_ & 3;
    *(undefined4 *)
     ((long)&(__return_storage_ptr__->
             super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
             )._elem._elem + 1) =
         local_90.
         super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
         ._elem._elem._1_4_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->
             super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
             )._elem._elem + 9) =
         local_90.
         super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
         ._elem._elem._9_8_;
    *(undefined4 *)
     ((long)&(__return_storage_ptr__->
             super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
             )._elem._elem + 0x11) =
         local_90.
         super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
         ._elem._elem._17_4_;
  }
  (__return_storage_ptr__->
  super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
  )._isSome = local_90.
              super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
              ._isSome == true;
  return __return_storage_ptr__;
}

Assistant:

Option<AnyAlascaLiteral> tryNormalizeInterpreted(Literal* lit) const
    {
      using Out = AnyAlascaLiteral;
      auto wrapCoproduct = [](auto&& norm) {
        return std::move(norm).map([](auto x) { return Out(x); });
      };
      return             wrapCoproduct(tryNormalizeInterpreted< IntTraits>(lit))
        || [&](){ return wrapCoproduct(tryNormalizeInterpreted< RatTraits>(lit)); }
        || [&](){ return wrapCoproduct(tryNormalizeInterpreted<RealTraits>(lit)); }
        || Option<Out>();
    }